

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common.cpp
# Opt level: O2

grid * idx2::GetGrid(grid *__return_storage_ptr__,idx2_file *Idx2,extent *Ext)

{
  int *piVar1;
  int iVar2;
  int D;
  long lVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  extent eVar13;
  v3i Strd3;
  extent local_40;
  
  local_40.From = 0;
  local_40.Dims =
       (ulong)((Idx2->Dims3).field_0.field_0.Z & 0x1fffff) << 0x2a |
       ((ulong)(uint)(Idx2->Dims3).field_0.field_0.Y & 0x1fffff) << 0x15 |
       (ulong)(uint)(Idx2->Dims3).field_0.field_0.X & 0x1fffff;
  eVar13 = Crop<idx2::extent,idx2::extent>(Ext,&local_40);
  local_40.From = 0x100000001;
  local_40.Dims = CONCAT44(local_40.Dims._4_4_,1);
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    piVar1 = (int *)((long)&local_40.From + lVar3 * 4);
    *piVar1 = *piVar1 <<
              (*(byte *)((long)&((v3i *)(&Idx2->DecodeSubbandMasks + -4))->field_0 + lVar3 * 4) &
              0x1f);
  }
  lVar3 = eVar13.From << 0x16;
  uVar11 = lVar3 >> 0xb;
  iVar6 = ((int)eVar13.From << 0xb) >> 0xb;
  iVar2 = (int)(eVar13.From * 2 >> 0x20);
  iVar4 = iVar2 >> 0xb;
  iVar12 = (int)local_40.From + (((int)eVar13.Dims << 0xb) >> 0xb) + iVar6 + -2;
  iVar9 = (int)(((long)(eVar13.Dims << 0x16) >> 0xb) + -0x100000000 + (uVar11 & 0xffffffff00000000)
               >> 0x20) + local_40.From._4_4_ + -1;
  iVar10 = (int)((long)(eVar13.Dims * 2) >> 0x2b) + iVar4 + (uint)local_40.Dims + -2;
  uVar7 = iVar6 - iVar6 % (int)local_40.From;
  iVar6 = (int)((ulong)lVar3 >> 0x20);
  uVar8 = (iVar6 >> 0xb) -
          (int)((long)((ulong)(uint)(iVar6 >> 0x1f) << 0x20 | uVar11 >> 0x20) %
               (long)(int)local_40.From._4_4_);
  uVar5 = iVar4 - (int)(CONCAT44(iVar2 >> 0x1f,iVar4) % (long)(int)(uint)local_40.Dims);
  (__return_storage_ptr__->super_extent).From =
       (ulong)(uVar5 & 0x1fffff) << 0x2a |
       (ulong)(uVar8 & 0x1fffff) << 0x15 | (ulong)(uVar7 & 0x1fffff);
  (__return_storage_ptr__->super_extent).Dims =
       (ulong)((int)(iVar10 - (iVar10 % (int)(uint)local_40.Dims + uVar5)) /
               (int)(uint)local_40.Dims + 1U & 0x1fffff) << 0x2a |
       (ulong)((int)(iVar9 - (iVar9 % (int)local_40.From._4_4_ + uVar8)) / (int)local_40.From._4_4_
               + 1U & 0x1fffff) << 0x15 |
       (ulong)((int)(iVar12 - (iVar12 % (int)local_40.From + uVar7)) / (int)local_40.From + 1U &
              0x1fffff);
  __return_storage_ptr__->Strd =
       (ulong)((uint)local_40.Dims & 0x1fffff) << 0x2a |
       ((ulong)local_40.From._4_4_ & 0x1fffff) << 0x15 | local_40.From & 0x1fffff;
  return __return_storage_ptr__;
}

Assistant:

grid
GetGrid(const idx2_file& Idx2, const extent& Ext)
{
  auto CroppedExt = Crop(Ext, extent(Idx2.Dims3));
  v3i Strd3(1); // start with stride (1, 1, 1)
  idx2_For (int, D, 0, 3)
    Strd3[D] <<= Idx2.DownsamplingFactor3[D];

  v3i First3 = From(CroppedExt);
  v3i Last3 = Last(CroppedExt);
  Last3 = ((Last3 + Strd3 - 1) / Strd3) * Strd3; // move last to the right
  First3 = (First3 / Strd3) * Strd3; // move first to the left

  return grid(First3, (Last3 - First3) / Strd3 + 1, Strd3);
}


static void
ComputeExtentsForTraversal(const idx2_file& Idx2,
                           const extent& Ext,
                           i8 Level,
                           extent* ExtentInFiles,
                           extent* VolExtentInFiles)
{
  v3i B3, C3, F3, Ff3, Fl3;
  B3 = Idx2.BrickDims3 * Pow(Idx2.GroupBrick3, Level);
  C3 = Idx2.BricksPerChunk3s[Level] * B3;
  F3 = C3 * Idx2.ChunksPerFile3s[Level];

  Ff3 = From(Ext) / F3;
  Fl3 = Last(Ext) / F3;
  *ExtentInFiles  = extent(Ff3, Fl3 - Ff3 + 1);

  extent VolExt(Idx2.Dims3);
  v3i Vff3 = From(VolExt) / F3;
  v3i Vfl3 = Last(VolExt) / F3;
  *VolExtentInFiles  = extent(Vff3, Vfl3 - Vff3 + 1);
}

using traverse_callback = error<idx2_err_code>(const traverse_item&);

error<idx2_err_code>
TraverseHierarchy(u64 TraverseOrder,
                  const v3i& From3,
                  const v3i& Dims3,
                  const extent& Extent, // in units of traverse_item
                  const extent& VolExtent, // in units of traverse_item
                  traverse_callback Callback)
{
  idx2_RAII(array<traverse_item>, Stack, Reserve(&Stack, 64), Dealloc(&Stack));
  v3i Dims3Ext((int)NextPow2(Dims3.X), (int)NextPow2(Dims3.Y), (int)NextPow2(Dims3.Z));
  traverse_item Top;
  Top.From3 = From3;
  Top.To3 = From3 + Dims3Ext;
  Top.TraverseOrder = Top.PrevTraverseOrder = TraverseOrder;
  PushBack(&Stack, Top);
  while (Size(Stack) >= 0)
  {
    Top = Back(Stack);
    int FD = Top.TraverseOrder & 0x3;
    Top.TraverseOrder >>= 2;
    if (FD == 3)
    {
      if (Top.TraverseOrder == 3)
        Top.TraverseOrder = Top.PrevTraverseOrder;
      else
        Top.PrevTraverseOrder = Top.TraverseOrder;
      continue;
    }
    PopBack(&Stack);
    if (!(Top.To3 - Top.From3 == 1))
    {
      traverse_item First = Top, Second = Top;
      First.To3[FD] =
        Top.From3[FD] + (Top.To3[FD] - Top.From3[FD]) / 2;
      Second.From3[FD] =
        Top.From3[FD] + (Top.To3[FD] - Top.From3[FD]) / 2;
      extent Skip(First.From3, First.To3 - First.From3);
      //Second.NItemsBefore = First.NItemsBefore + Prod<u64>(Dims(Crop(Skip, Extent)));
      Second.ItemOrder = First.ItemOrder + Prod<i32>(Dims(Crop(Skip, VolExtent)));
      First.Address = Top.Address;
      Second.Address = Top.Address + Prod<u64>(First.To3 - First.From3);
      if (Second.From3 < To(Extent) && From(Extent) < Second.To3)
        PushBack(&Stack, Second);
      if (First.From3 < To(Extent) && From(Extent) < First.To3)
        PushBack(&Stack, First);
    }
    else
    {
      Top.LastItem = Size(Stack) == 0;
      idx2_PropagateIfError(Callback(Top));
    }
  }
}


}